

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O2

HRESULT __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::SysAllocErrorLine
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,int32 ichMinLine,BSTR *pbstrLine)

{
  code *pcVar1;
  bool bVar2;
  charcount_t cVar3;
  charcount_t cVar4;
  undefined4 *puVar5;
  size_t sVar6;
  BSTR pch;
  EncodedCharPtr puVar7;
  HRESULT HVar8;
  size_t local_40;
  size_t cb;
  
  if (pbstrLine == (BSTR *)0x0) {
    HVar8 = -0x7fffbffd;
  }
  else {
    HVar8 = -0x7fff0001;
    if ((-1 < ichMinLine) &&
       ((ulong)(uint)ichMinLine <= (ulong)((long)this->m_pchLast - (long)this->m_pchBase))) {
      cVar3 = IchMinLine(this);
      if (cVar3 == ichMinLine) {
        cb = (size_t)this->m_pchMinLine;
      }
      else {
        puVar7 = this->m_pchBase;
        sVar6 = UTF8EncodingPolicyBase<false>::CharacterOffsetToUnitOffset
                          (&this->super_UTF8EncodingPolicyBase<false>,puVar7,
                           this->m_currentCharacter,this->m_pchLast,ichMinLine);
        cb = (size_t)(puVar7 + sVar6);
      }
      local_40 = 0;
      cVar3 = LineLength(this,(EncodedCharPtr)cb,this->m_pchLast,&local_40);
      if ((int)cVar3 < 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                           ,0x937,"(cch <= 2147483647L)","cch <= LONG_MAX");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
      }
      cVar4 = IchMinLine(this);
      if (cVar4 == ichMinLine) {
        puVar7 = this->m_pchMinLine + local_40;
      }
      else {
        puVar7 = this->m_pchBase;
        sVar6 = UTF8EncodingPolicyBase<false>::CharacterOffsetToUnitOffset
                          (&this->super_UTF8EncodingPolicyBase<false>,puVar7,
                           this->m_currentCharacter,this->m_pchLast,cVar3);
        puVar7 = puVar7 + sVar6;
      }
      HVar8 = 0;
      pch = SysAllocStringLen((OLECHAR *)0x0,cVar3);
      *pbstrLine = pch;
      if (pch == (BSTR)0x0) {
        HVar8 = -0x7ff8fff2;
      }
      else {
        UTF8EncodingPolicyBase<false>::ConvertToUnicode
                  (&this->super_UTF8EncodingPolicyBase<false>,pch,cVar3,(EncodedCharPtr)cb,puVar7);
      }
    }
  }
  return HVar8;
}

Assistant:

HRESULT Scanner<EncodingPolicy>::SysAllocErrorLine(int32 ichMinLine, __out BSTR* pbstrLine)
{
    if( !pbstrLine )
    {
        return E_POINTER;
    }

    // If we overflow the string, we have a serious problem...
    if (ichMinLine < 0 || static_cast<size_t>(ichMinLine) > AdjustedLength() )
    {
        return E_UNEXPECTED;
    }

    typename EncodingPolicy::EncodedCharPtr pStart = static_cast<size_t>(ichMinLine) == IchMinLine() ? m_pchMinLine : m_pchBase + this->CharacterOffsetToUnitOffset(m_pchBase, m_currentCharacter, m_pchLast, ichMinLine);

    // Determine the length by scanning for the next newline
    size_t cb = 0;
    charcount_t cch = LineLength(pStart, m_pchLast, &cb);
    Assert(cch <= LONG_MAX);

    typename EncodingPolicy::EncodedCharPtr pEnd = static_cast<size_t>(ichMinLine) == IchMinLine() ? m_pchMinLine + cb : m_pchBase + this->CharacterOffsetToUnitOffset(m_pchBase, m_currentCharacter, m_pchLast, cch);

    *pbstrLine = SysAllocStringLen(NULL, cch);
    if (!*pbstrLine)
    {
        return E_OUTOFMEMORY;
    }

    this->ConvertToUnicode(*pbstrLine, cch, pStart, pEnd);
    return S_OK;
}